

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O2

bool __thiscall TGAImage::flip_horizontally(TGAImage *this)

{
  TGAColor TVar1;
  int j;
  int y;
  uint x;
  TGAColor c2;
  TGAColor c1;
  TGAColor local_50;
  TGAColor local_48 [2];
  uint local_3c;
  uchar *local_38;
  
  local_38 = this->data;
  if (local_38 != (uchar *)0x0) {
    local_3c = this->width >> 1;
    x = 0;
    if ((int)local_3c < 1) {
      local_3c = 0;
    }
    for (; x != local_3c; x = x + 1) {
      for (y = 0; y < this->height; y = y + 1) {
        TVar1 = get(this,x,y);
        local_48[0].bgra = TVar1.bgra;
        local_48[0].bytespp = TVar1.bytespp;
        TVar1 = get(this,this->width + ~x,y);
        local_50.bgra = TVar1.bgra;
        local_50.bytespp = TVar1.bytespp;
        set(this,x,y,&local_50);
        set(this,this->width + ~x,y,local_48);
      }
    }
  }
  return local_38 != (uchar *)0x0;
}

Assistant:

bool TGAImage::flip_horizontally() {
    if (!data) return false;
    int half = width>>1;
    for (int i=0; i<half; i++) {
        for (int j=0; j<height; j++) {
            TGAColor c1 = get(i, j);
            TGAColor c2 = get(width-1-i, j);
            set(i, j, c2);
            set(width-1-i, j, c1);
        }
    }
    return true;
}